

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpgd.cpp
# Opt level: O1

void jpgd::DCT_Upsample::P_Q<8,_8>::calc(Matrix44 *P,Matrix44 *Q,jpgd_block_t *pSrc)

{
  short sVar1;
  short sVar2;
  short sVar3;
  short sVar4;
  short sVar5;
  short sVar6;
  short sVar7;
  short sVar8;
  short sVar9;
  short sVar10;
  short sVar11;
  short sVar12;
  short sVar13;
  short sVar14;
  short sVar15;
  short sVar16;
  short sVar17;
  short sVar18;
  short sVar19;
  short sVar20;
  short sVar21;
  short sVar22;
  short sVar23;
  short sVar24;
  short sVar25;
  short sVar26;
  short sVar27;
  short sVar28;
  short sVar29;
  short sVar30;
  short sVar31;
  short sVar32;
  short sVar33;
  short sVar34;
  short sVar35;
  short sVar36;
  short sVar37;
  short sVar38;
  short sVar39;
  int iVar40;
  int iVar41;
  int iVar42;
  int iVar43;
  int iVar44;
  int iVar45;
  int iVar46;
  int iVar47;
  int iVar48;
  int iVar49;
  int iVar50;
  int iVar51;
  int iVar52;
  int iVar53;
  int iVar54;
  int iVar55;
  
  sVar1 = pSrc[1];
  sVar2 = pSrc[3];
  sVar3 = pSrc[5];
  sVar4 = pSrc[7];
  sVar5 = pSrc[9];
  sVar6 = pSrc[0xb];
  sVar7 = pSrc[0xd];
  sVar8 = pSrc[0xf];
  sVar9 = pSrc[0x19];
  sVar10 = pSrc[0x1b];
  sVar11 = pSrc[0x1d];
  sVar12 = pSrc[0x1f];
  sVar13 = pSrc[0x21];
  sVar14 = pSrc[0x23];
  sVar15 = pSrc[0x25];
  sVar16 = pSrc[0x27];
  sVar17 = pSrc[0x29];
  sVar18 = pSrc[0x2b];
  sVar19 = pSrc[0x2d];
  sVar20 = pSrc[0x2f];
  sVar21 = pSrc[0x39];
  sVar22 = pSrc[0x3b];
  sVar23 = pSrc[0x3d];
  sVar24 = pSrc[0x3f];
  iVar50 = (int)pSrc[8];
  sVar25 = pSrc[0x10];
  iVar48 = (int)pSrc[0x18];
  sVar26 = pSrc[0x20];
  iVar49 = (int)pSrc[0x28];
  sVar27 = pSrc[0x30];
  iVar46 = (int)pSrc[0x38];
  sVar28 = pSrc[0x11];
  sVar29 = pSrc[0x13];
  sVar30 = pSrc[0x15];
  sVar31 = pSrc[0x17];
  sVar32 = pSrc[0x31];
  sVar33 = pSrc[0x33];
  sVar34 = pSrc[0x35];
  sVar35 = pSrc[0x37];
  sVar36 = pSrc[4];
  iVar40 = (int)pSrc[0xc];
  sVar37 = pSrc[0x14];
  iVar41 = (int)pSrc[0x1c];
  sVar38 = pSrc[0x24];
  iVar42 = (int)pSrc[0x2c];
  sVar39 = pSrc[0x34];
  iVar43 = (int)pSrc[0x3c];
  P->v[0][0] = (int)*pSrc;
  P->v[0][1] = iVar46 * 0x11c + iVar49 * -0x168 + iVar48 * 0x32a + iVar50 * 0x1aa + 0x200 >> 10;
  P->v[0][2] = (int)sVar26;
  P->v[0][3] = iVar46 * 0x377 + iVar49 * 0x1f6 + iVar48 * -99 + iVar50 * 0x17 + 0x200 >> 10;
  P->v[1][0] = sVar4 * 0x11c + sVar3 * -0x168 + sVar2 * 0x32a + sVar1 * 0x1aa + 0x200 >> 10;
  iVar44 = sVar8 * 0x11c + sVar7 * -0x168 + sVar6 * 0x32a + sVar5 * 0x1aa + 0x200 >> 10;
  iVar47 = sVar12 * 0x11c + sVar11 * -0x168 + sVar10 * 0x32a + sVar9 * 0x1aa + 0x200 >> 10;
  iVar45 = sVar20 * 0x11c + sVar19 * -0x168 + sVar18 * 0x32a + sVar17 * 0x1aa + 0x200 >> 10;
  iVar51 = sVar24 * 0x11c + sVar23 * -0x168 + sVar22 * 0x32a + sVar21 * 0x1aa + 0x200 >> 10;
  P->v[1][1] = iVar51 * 0x11c + iVar45 * -0x168 + iVar47 * 0x32a + iVar44 * 0x1aa + 0x200 >> 10;
  P->v[1][2] = sVar16 * 0x11c + sVar15 * -0x168 + sVar14 * 0x32a + sVar13 * 0x1aa + 0x200 >> 10;
  P->v[1][3] = iVar51 * 0x377 + iVar45 * 0x1f6 + iVar47 * -99 + iVar44 * 0x17 + 0x200 >> 10;
  P->v[2][0] = (int)sVar36;
  P->v[2][1] = iVar43 * 0x11c + iVar42 * -0x168 + iVar41 * 0x32a + iVar40 * 0x1aa + 0x200 >> 10;
  P->v[2][2] = (int)sVar38;
  P->v[2][3] = iVar43 * 0x377 + iVar42 * 0x1f6 + iVar41 * -99 + iVar40 * 0x17 + 0x200 >> 10;
  P->v[3][0] = sVar4 * 0x377 + sVar3 * 0x1f6 + sVar2 * -99 + sVar1 * 0x17 + 0x200 >> 10;
  iVar52 = sVar8 * 0x377 + sVar7 * 0x1f6 + sVar6 * -99 + sVar5 * 0x17 + 0x200 >> 10;
  iVar53 = sVar12 * 0x377 + sVar11 * 0x1f6 + sVar10 * -99 + sVar9 * 0x17 + 0x200 >> 10;
  iVar54 = sVar20 * 0x377 + sVar19 * 0x1f6 + sVar18 * -99 + sVar17 * 0x17 + 0x200 >> 10;
  iVar55 = sVar24 * 0x377 + sVar23 * 0x1f6 + sVar22 * -99 + sVar21 * 0x17 + 0x200 >> 10;
  P->v[3][1] = iVar55 * 0x11c + iVar54 * -0x168 + iVar53 * 0x32a + iVar52 * 0x1aa + 0x200 >> 10;
  P->v[3][2] = sVar16 * 0x377 + sVar15 * 0x1f6 + sVar14 * -99 + sVar13 * 0x17 + 0x200 >> 10;
  P->v[3][3] = iVar55 * 0x377 + iVar54 * 0x1f6 + iVar53 * -99 + iVar52 * 0x17 + 0x200 >> 10;
  Q->v[0][0] = iVar46 * -0xb8 + iVar49 * 0xda + iVar48 * -0x145 + iVar50 * 0x3a0 + 0x200 >> 10;
  Q->v[0][1] = (int)sVar25;
  Q->v[0][2] = iVar46 * -0x17f + iVar49 * 0x313 + iVar48 * 0x20e + iVar50 * -0x4b + 0x200 >> 10;
  Q->v[0][3] = (int)sVar27;
  Q->v[1][0] = iVar51 * -0xb8 + iVar45 * 0xda + iVar47 * -0x145 + iVar44 * 0x3a0 + 0x200 >> 10;
  Q->v[1][1] = sVar31 * 0x11c + sVar30 * -0x168 + sVar29 * 0x32a + sVar28 * 0x1aa + 0x200 >> 10;
  Q->v[1][2] = iVar51 * -0x17f + iVar45 * 0x313 + iVar47 * 0x20e + iVar44 * -0x4b + 0x200 >> 10;
  Q->v[1][3] = sVar35 * 0x11c + sVar34 * -0x168 + sVar33 * 0x32a + sVar32 * 0x1aa + 0x200 >> 10;
  Q->v[2][0] = iVar43 * -0xb8 + iVar42 * 0xda + iVar41 * -0x145 + iVar40 * 0x3a0 + 0x200 >> 10;
  Q->v[2][1] = (int)sVar37;
  Q->v[2][2] = iVar43 * -0x17f + iVar42 * 0x313 + iVar41 * 0x20e + iVar40 * -0x4b + 0x200 >> 10;
  Q->v[2][3] = (int)sVar39;
  Q->v[3][0] = iVar55 * -0xb8 + iVar54 * 0xda + iVar53 * -0x145 + iVar52 * 0x3a0 + 0x200 >> 10;
  Q->v[3][1] = sVar31 * 0x377 + sVar30 * 0x1f6 + sVar29 * -99 + sVar28 * 0x17 + 0x200 >> 10;
  Q->v[3][2] = iVar55 * -0x17f + iVar54 * 0x313 + iVar53 * 0x20e + iVar52 * -0x4b + 0x200 >> 10;
  Q->v[3][3] = sVar35 * 0x377 + sVar34 * 0x1f6 + sVar33 * -99 + sVar32 * 0x17 + 0x200 >> 10;
  return;
}

Assistant:

static void calc(Matrix44& P, Matrix44& Q, const jpgd_block_t* pSrc)
    {
      // 4x8 = 4x8 times 8x8, matrix 0 is constant
      const Temp_Type X000 = AT(0, 0);
      const Temp_Type X001 = AT(0, 1);
      const Temp_Type X002 = AT(0, 2);
      const Temp_Type X003 = AT(0, 3);
      const Temp_Type X004 = AT(0, 4);
      const Temp_Type X005 = AT(0, 5);
      const Temp_Type X006 = AT(0, 6);
      const Temp_Type X007 = AT(0, 7);
      const Temp_Type X010 = D(F(0.415735f) * AT(1, 0) + F(0.791065f) * AT(3, 0) + F(-0.352443f) * AT(5, 0) + F(0.277785f) * AT(7, 0));
      const Temp_Type X011 = D(F(0.415735f) * AT(1, 1) + F(0.791065f) * AT(3, 1) + F(-0.352443f) * AT(5, 1) + F(0.277785f) * AT(7, 1));
      const Temp_Type X012 = D(F(0.415735f) * AT(1, 2) + F(0.791065f) * AT(3, 2) + F(-0.352443f) * AT(5, 2) + F(0.277785f) * AT(7, 2));
      const Temp_Type X013 = D(F(0.415735f) * AT(1, 3) + F(0.791065f) * AT(3, 3) + F(-0.352443f) * AT(5, 3) + F(0.277785f) * AT(7, 3));
      const Temp_Type X014 = D(F(0.415735f) * AT(1, 4) + F(0.791065f) * AT(3, 4) + F(-0.352443f) * AT(5, 4) + F(0.277785f) * AT(7, 4));
      const Temp_Type X015 = D(F(0.415735f) * AT(1, 5) + F(0.791065f) * AT(3, 5) + F(-0.352443f) * AT(5, 5) + F(0.277785f) * AT(7, 5));
      const Temp_Type X016 = D(F(0.415735f) * AT(1, 6) + F(0.791065f) * AT(3, 6) + F(-0.352443f) * AT(5, 6) + F(0.277785f) * AT(7, 6));
      const Temp_Type X017 = D(F(0.415735f) * AT(1, 7) + F(0.791065f) * AT(3, 7) + F(-0.352443f) * AT(5, 7) + F(0.277785f) * AT(7, 7));
      const Temp_Type X020 = AT(4, 0);
      const Temp_Type X021 = AT(4, 1);
      const Temp_Type X022 = AT(4, 2);
      const Temp_Type X023 = AT(4, 3);
      const Temp_Type X024 = AT(4, 4);
      const Temp_Type X025 = AT(4, 5);
      const Temp_Type X026 = AT(4, 6);
      const Temp_Type X027 = AT(4, 7);
      const Temp_Type X030 = D(F(0.022887f) * AT(1, 0) + F(-0.097545f) * AT(3, 0) + F(0.490393f) * AT(5, 0) + F(0.865723f) * AT(7, 0));
      const Temp_Type X031 = D(F(0.022887f) * AT(1, 1) + F(-0.097545f) * AT(3, 1) + F(0.490393f) * AT(5, 1) + F(0.865723f) * AT(7, 1));
      const Temp_Type X032 = D(F(0.022887f) * AT(1, 2) + F(-0.097545f) * AT(3, 2) + F(0.490393f) * AT(5, 2) + F(0.865723f) * AT(7, 2));
      const Temp_Type X033 = D(F(0.022887f) * AT(1, 3) + F(-0.097545f) * AT(3, 3) + F(0.490393f) * AT(5, 3) + F(0.865723f) * AT(7, 3));
      const Temp_Type X034 = D(F(0.022887f) * AT(1, 4) + F(-0.097545f) * AT(3, 4) + F(0.490393f) * AT(5, 4) + F(0.865723f) * AT(7, 4));
      const Temp_Type X035 = D(F(0.022887f) * AT(1, 5) + F(-0.097545f) * AT(3, 5) + F(0.490393f) * AT(5, 5) + F(0.865723f) * AT(7, 5));
      const Temp_Type X036 = D(F(0.022887f) * AT(1, 6) + F(-0.097545f) * AT(3, 6) + F(0.490393f) * AT(5, 6) + F(0.865723f) * AT(7, 6));
      const Temp_Type X037 = D(F(0.022887f) * AT(1, 7) + F(-0.097545f) * AT(3, 7) + F(0.490393f) * AT(5, 7) + F(0.865723f) * AT(7, 7));

      // 4x4 = 4x8 times 8x4, matrix 1 is constant
      P.at(0, 0) = X000;
      P.at(0, 1) = D(X001 * F(0.415735f) + X003 * F(0.791065f) + X005 * F(-0.352443f) + X007 * F(0.277785f));
      P.at(0, 2) = X004;
      P.at(0, 3) = D(X001 * F(0.022887f) + X003 * F(-0.097545f) + X005 * F(0.490393f) + X007 * F(0.865723f));
      P.at(1, 0) = X010;
      P.at(1, 1) = D(X011 * F(0.415735f) + X013 * F(0.791065f) + X015 * F(-0.352443f) + X017 * F(0.277785f));
      P.at(1, 2) = X014;
      P.at(1, 3) = D(X011 * F(0.022887f) + X013 * F(-0.097545f) + X015 * F(0.490393f) + X017 * F(0.865723f));
      P.at(2, 0) = X020;
      P.at(2, 1) = D(X021 * F(0.415735f) + X023 * F(0.791065f) + X025 * F(-0.352443f) + X027 * F(0.277785f));
      P.at(2, 2) = X024;
      P.at(2, 3) = D(X021 * F(0.022887f) + X023 * F(-0.097545f) + X025 * F(0.490393f) + X027 * F(0.865723f));
      P.at(3, 0) = X030;
      P.at(3, 1) = D(X031 * F(0.415735f) + X033 * F(0.791065f) + X035 * F(-0.352443f) + X037 * F(0.277785f));
      P.at(3, 2) = X034;
      P.at(3, 3) = D(X031 * F(0.022887f) + X033 * F(-0.097545f) + X035 * F(0.490393f) + X037 * F(0.865723f));
      // 40 muls 24 adds

      // 4x4 = 4x8 times 8x4, matrix 1 is constant
      Q.at(0, 0) = D(X001 * F(0.906127f) + X003 * F(-0.318190f) + X005 * F(0.212608f) + X007 * F(-0.180240f));
      Q.at(0, 1) = X002;
      Q.at(0, 2) = D(X001 * F(-0.074658f) + X003 * F(0.513280f) + X005 * F(0.768178f) + X007 * F(-0.375330f));
      Q.at(0, 3) = X006;
      Q.at(1, 0) = D(X011 * F(0.906127f) + X013 * F(-0.318190f) + X015 * F(0.212608f) + X017 * F(-0.180240f));
      Q.at(1, 1) = X012;
      Q.at(1, 2) = D(X011 * F(-0.074658f) + X013 * F(0.513280f) + X015 * F(0.768178f) + X017 * F(-0.375330f));
      Q.at(1, 3) = X016;
      Q.at(2, 0) = D(X021 * F(0.906127f) + X023 * F(-0.318190f) + X025 * F(0.212608f) + X027 * F(-0.180240f));
      Q.at(2, 1) = X022;
      Q.at(2, 2) = D(X021 * F(-0.074658f) + X023 * F(0.513280f) + X025 * F(0.768178f) + X027 * F(-0.375330f));
      Q.at(2, 3) = X026;
      Q.at(3, 0) = D(X031 * F(0.906127f) + X033 * F(-0.318190f) + X035 * F(0.212608f) + X037 * F(-0.180240f));
      Q.at(3, 1) = X032;
      Q.at(3, 2) = D(X031 * F(-0.074658f) + X033 * F(0.513280f) + X035 * F(0.768178f) + X037 * F(-0.375330f));
      Q.at(3, 3) = X036;
      // 40 muls 24 adds
    }